

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkmanagerservice.cpp
# Opt level: O0

optional<QDBusInterface> * getPrimaryDevice(QDBusObjectPath *devicePath)

{
  QLatin1StringView latin1;
  bool bVar1;
  ulong uVar2;
  char *in_RSI;
  QDBusConnection *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  QDBusObjectPath primaryDevicePath;
  QList<QDBusObjectPath> devicePaths;
  QDBusInterface connection;
  QDBusConnection *__args_3;
  QLatin1String *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  QLatin1String *__args;
  char *pcVar4;
  QDBusConnection local_f8 [8];
  QLatin1StringView local_f0;
  QLatin1StringView local_c8;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  QDBusConnection local_88 [8];
  undefined1 local_80 [24];
  undefined1 local_68 [24];
  undefined1 local_50 [24];
  undefined8 local_38;
  undefined8 local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  __args_3 = in_RDI;
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffec8,(size_t)in_RDI);
  pcVar4 = QVar3.m_data;
  QVar3.m_data = in_RSI;
  QVar3.m_size = (qsizetype)pcVar4;
  QString::QString((QString *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),QVar3);
  QDBusObjectPath::path((QDBusObjectPath *)in_RDI);
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffec8,(size_t)__args_3);
  __args = (QLatin1String *)QVar3.m_size;
  latin1.m_data = in_RSI;
  latin1.m_size = (qsizetype)pcVar4;
  QString::QString((QString *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),latin1);
  QDBusConnection::systemBus();
  QDBusInterface::QDBusInterface
            ((QDBusInterface *)&local_38,(QString *)local_50,(QString *)local_68,(QString *)local_80
             ,local_88,(QObject *)0x0);
  QDBusConnection::~QDBusConnection(local_88);
  QString::~QString((QString *)0x1093ab);
  QString::~QString((QString *)0x1093b8);
  QString::~QString((QString *)0x1093c5);
  uVar2 = QDBusAbstractInterface::isValid();
  if ((uVar2 & 1) == 0) {
    std::optional<QDBusInterface>::optional((optional<QDBusInterface> *)in_RDI);
  }
  else {
    local_a0 = 0xaaaaaaaaaaaaaaaa;
    local_98 = 0xaaaaaaaaaaaaaaaa;
    local_90 = 0xaaaaaaaaaaaaaaaa;
    QObject::property((char *)&local_28);
    QVariant::value<QList<QDBusObjectPath>>((QVariant *)in_RDI);
    QVariant::~QVariant(&local_28);
    bVar1 = QList<QDBusObjectPath>::isEmpty((QList<QDBusObjectPath> *)0x109464);
    if (bVar1) {
      std::optional<QDBusInterface>::optional((optional<QDBusInterface> *)in_RDI);
    }
    else {
      local_b8 = 0xaaaaaaaaaaaaaaaa;
      local_b0 = 0xaaaaaaaaaaaaaaaa;
      local_a8 = 0xaaaaaaaaaaaaaaaa;
      QList<QDBusObjectPath>::front((QList<QDBusObjectPath> *)0x1094ba);
      QDBusObjectPath::QDBusObjectPath((QDBusObjectPath *)__args_3,(QDBusObjectPath *)in_RDI);
      local_c8 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)in_stack_fffffffffffffec8,(size_t)__args_3);
      QDBusObjectPath::path((QDBusObjectPath *)in_RDI);
      local_f0 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)in_stack_fffffffffffffec8,(size_t)__args_3);
      QDBusConnection::systemBus();
      std::make_optional<QDBusInterface,QLatin1String,QString,QLatin1String,QDBusConnection>
                (__args,(QString *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8,__args_3);
      QDBusConnection::~QDBusConnection(local_f8);
      QString::~QString((QString *)0x109556);
      QDBusObjectPath::~QDBusObjectPath((QDBusObjectPath *)0x10956b);
    }
    QList<QDBusObjectPath>::~QList((QList<QDBusObjectPath> *)0x109578);
  }
  QDBusInterface::~QDBusInterface((QDBusInterface *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (optional<QDBusInterface> *)__args_3;
  }
  __stack_chk_fail();
}

Assistant:

static std::optional<QDBusInterface> getPrimaryDevice(const QDBusObjectPath &devicePath)
{
    const QDBusInterface connection(NM_DBUS_SERVICE, devicePath.path(),
                                    NM_CONNECTION_DBUS_INTERFACE, QDBusConnection::systemBus());
    if (!connection.isValid())
        return std::nullopt;

    const auto devicePaths = connection.property("Devices").value<QList<QDBusObjectPath>>();
    if (devicePaths.isEmpty())
        return std::nullopt;

    const QDBusObjectPath primaryDevicePath = devicePaths.front();
    return std::make_optional<QDBusInterface>(NM_DBUS_SERVICE, primaryDevicePath.path(),
                                              NM_DEVICE_DBUS_INTERFACE,
                                              QDBusConnection::systemBus());
}